

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

void __thiscall
TPZFrontSym<std::complex<float>_>::PrintGlobal
          (TPZFrontSym<std::complex<float>_> *this,char *name,ostream *out)

{
  long *plVar1;
  long lVar2;
  char cVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (name == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar4 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar4);
  }
  cVar3 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  if (0 < (this->super_TPZFront<std::complex<float>_>).fLocal.fNElements) {
    lVar9 = 0;
    do {
      if ((this->super_TPZFront<std::complex<float>_>).fLocal.fStore[lVar9] != -1) {
        poVar5 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->super_TPZFront<std::complex<float>_>).fLocal.fNElements);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  if (0 < (this->super_TPZFront<std::complex<float>_>).fLocal.fNElements) {
    lVar9 = 0;
    do {
      if ((this->super_TPZFront<std::complex<float>_>).fLocal.fStore[lVar9] != -1) {
        if (0 < (this->super_TPZFront<std::complex<float>_>).fLocal.fNElements) {
          lVar8 = 0;
          do {
            plVar1 = (this->super_TPZFront<std::complex<float>_>).fLocal.fStore;
            lVar6 = plVar1[lVar8];
            if (lVar6 != -1) {
              lVar2 = plVar1[lVar9];
              lVar7 = lVar6;
              if (lVar6 < lVar2) {
                lVar7 = lVar2;
              }
              if (lVar2 < lVar6) {
                lVar6 = lVar2;
              }
              lVar7 = (lVar7 + 1) * lVar7;
              poVar5 = std::operator<<(out,(complex *)
                                           ((long)&(this->super_TPZFront<std::complex<float>_>).
                                                   fData.fStore[lVar6]._M_value +
                                           (lVar7 - (lVar7 >> 0x3f) & 0xfffffffffffffffeU) * 4));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (this->super_TPZFront<std::complex<float>_>).fLocal.fNElements);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->super_TPZFront<std::complex<float>_>).fLocal.fNElements);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZFrontSym<TVar>::PrintGlobal(const char *name, std::ostream& out){
	int64_t i, j;
	out << name << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]!=-1) out << i << " ";
	}
	out << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]==-1) continue;
		for(j=0;j<this->fLocal.NElements();j++){
			if(this->fLocal[j]==-1) continue;
			out << Element(this->fLocal[i],this->fLocal[j]) << " ";
		}
		out << endl;
	}
	out << endl;
}